

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O0

Node * __thiscall RedBlackTree::deleteBST(RedBlackTree *this,Node **root,int data)

{
  Node *pNVar1;
  Node *temp;
  int data_local;
  Node **root_local;
  RedBlackTree *this_local;
  
  if (*root == (Node *)0x0) {
    this_local = (RedBlackTree *)*root;
  }
  else if (data < (*root)->value) {
    this_local = (RedBlackTree *)deleteBST(this,&(*root)->left,data);
  }
  else if ((*root)->value < data) {
    this_local = (RedBlackTree *)deleteBST(this,&(*root)->right,data);
  }
  else if (((*root)->left == (Node *)0x0) || ((*root)->right == (Node *)0x0)) {
    this_local = (RedBlackTree *)*root;
  }
  else {
    pNVar1 = findMin(this,&(*root)->right);
    (*root)->value = pNVar1->value;
    this_local = (RedBlackTree *)deleteBST(this,&(*root)->right,pNVar1->value);
  }
  return (Node *)this_local;
}

Assistant:

RedBlackTree::Node *RedBlackTree::deleteBST(Node *&root, int data) {
    if (root == nullptr) {
        return root;
    }

    if (data < root->value) {
        return deleteBST(root->left, data);
    }

    if (data > root->value) {
        return deleteBST(root->right, data);
    }

    if (root->left == nullptr || root->right == nullptr) {
        return root;
    }

    Node *temp = findMin(root->right);
    root->value = temp->value;
    return deleteBST(root->right, temp->value);
}